

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler.cpp
# Opt level: O0

void __thiscall LockstepScheduler::set_absolute_time(LockstepScheduler *this,uint64_t time_us)

{
  bool bVar1;
  iterator __position;
  element_type *peVar2;
  ulong in_RSI;
  long in_RDI;
  shared_ptr<LockstepScheduler::TimedWait> temp_timed_wait;
  iterator it;
  unique_lock<std::mutex> lock_timed_waits;
  mutex_type *in_stack_ffffffffffffff58;
  iterator in_stack_ffffffffffffff60;
  __int_type in_stack_ffffffffffffff68;
  iterator in_stack_ffffffffffffff70;
  __normal_iterator<std::shared_ptr<LockstepScheduler::TimedWait>_*,_std::vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>_>
  local_28 [3];
  ulong local_10;
  
  local_10 = in_RSI;
  std::__atomic_base<unsigned_long>::operator=
            ((__atomic_base<unsigned_long> *)in_stack_ffffffffffffff70._M_current,
             in_stack_ffffffffffffff68);
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_stack_ffffffffffffff60._M_current,
             in_stack_ffffffffffffff58);
  local_28[0]._M_current =
       (shared_ptr<LockstepScheduler::TimedWait> *)
       std::
       begin<std::vector<std::shared_ptr<LockstepScheduler::TimedWait>,std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>>>>
                 ((vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
                   *)in_stack_ffffffffffffff58);
  do {
    __position = std::
                 end<std::vector<std::shared_ptr<LockstepScheduler::TimedWait>,std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>>>>
                           ((vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
                             *)in_stack_ffffffffffffff58);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<LockstepScheduler::TimedWait>_*,_std::vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>_>
                        *)in_stack_ffffffffffffff60._M_current,
                       (__normal_iterator<std::shared_ptr<LockstepScheduler::TimedWait>_*,_std::vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) {
      std::unique_lock<std::mutex>::~unique_lock
                ((unique_lock<std::mutex> *)in_stack_ffffffffffffff60._M_current);
      return;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<LockstepScheduler::TimedWait>_*,_std::vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>_>
    ::operator*(local_28);
    std::shared_ptr<LockstepScheduler::TimedWait>::shared_ptr
              (in_stack_ffffffffffffff60._M_current,
               (shared_ptr<LockstepScheduler::TimedWait> *)in_stack_ffffffffffffff58);
    peVar2 = std::
             __shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x116207);
    if ((peVar2->done & 1U) == 0) {
      peVar2 = std::
               __shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1162a5);
      if (((peVar2->time_us <= local_10) &&
          (peVar2 = std::
                    __shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)0x1162c1), (peVar2->timeout & 1U) == 0)) &&
         (peVar2 = std::
                   __shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1162d5), (peVar2->done & 1U) == 0)) {
        peVar2 = std::
                 __shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1162e9);
        peVar2->timeout = true;
        *(undefined1 *)(in_RDI + 0x48) = 0;
        peVar2 = std::
                 __shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x116303);
        pthread_mutex_lock((pthread_mutex_t *)peVar2->passed_lock);
        peVar2 = std::
                 __shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x116316);
        pthread_cond_broadcast((pthread_cond_t *)peVar2->passed_cond);
        peVar2 = std::
                 __shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x116328);
        pthread_mutex_unlock((pthread_mutex_t *)peVar2->passed_lock);
        if ((*(byte *)(in_RDI + 0x48) & 1) != 0) {
          in_stack_ffffffffffffff60 =
               std::
               begin<std::vector<std::shared_ptr<LockstepScheduler::TimedWait>,std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>>>>
                         ((vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
                           *)in_stack_ffffffffffffff58);
          local_28[0]._M_current =
               (shared_ptr<LockstepScheduler::TimedWait> *)in_stack_ffffffffffffff60;
          goto LAB_00116389;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<LockstepScheduler::TimedWait>_*,_std::vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>_>
      ::operator++(local_28);
    }
    else {
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<LockstepScheduler::TimedWait>const*,std::vector<std::shared_ptr<LockstepScheduler::TimedWait>,std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>>>>
      ::__normal_iterator<std::shared_ptr<LockstepScheduler::TimedWait>*>
                ((__normal_iterator<const_std::shared_ptr<LockstepScheduler::TimedWait>_*,_std::vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>_>
                  *)in_stack_ffffffffffffff60._M_current,
                 (__normal_iterator<std::shared_ptr<LockstepScheduler::TimedWait>_*,_std::vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>_>
                  *)in_stack_ffffffffffffff58);
      in_stack_ffffffffffffff70 =
           std::
           vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
           ::erase((vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
                    *)in_stack_ffffffffffffff70._M_current,(const_iterator)__position._M_current);
      local_28[0]._M_current = (shared_ptr<LockstepScheduler::TimedWait> *)in_stack_ffffffffffffff70
      ;
    }
LAB_00116389:
    std::shared_ptr<LockstepScheduler::TimedWait>::~shared_ptr
              ((shared_ptr<LockstepScheduler::TimedWait> *)0x116393);
  } while( true );
}

Assistant:

void LockstepScheduler::set_absolute_time(uint64_t time_us)
{
    time_us_ = time_us;

    {
        std::unique_lock<std::mutex> lock_timed_waits(timed_waits_mutex_);

        auto it = std::begin(timed_waits_);
        while (it != std::end(timed_waits_)) {

            std::shared_ptr<TimedWait> temp_timed_wait = *it;

            // Clean up the ones that are already done from last iteration.
            if (temp_timed_wait->done) {
                it = timed_waits_.erase(it);
                continue;
            }

            if (temp_timed_wait->time_us <= time_us &&
                    !temp_timed_wait->timeout &&
                    !temp_timed_wait->done) {
                temp_timed_wait->timeout = true;
                // We are abusing the condition here to signal that the time
                // has passed.
                timed_waits_iterator_invalidated_ = false;
                pthread_mutex_lock(temp_timed_wait->passed_lock);
                pthread_cond_broadcast(temp_timed_wait->passed_cond);
                pthread_mutex_unlock(temp_timed_wait->passed_lock);
                if (timed_waits_iterator_invalidated_) {
                    // The vector might have changed, we need to start from the
                    // beginning.
                    it = std::begin(timed_waits_);
                    continue;
                }
            }
            ++it;
        }
    }
}